

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

bool __thiscall
MultiSigningProvider::GetKeyOrigin(MultiSigningProvider *this,CKeyID *keyid,KeyOriginInfo *info)

{
  long lVar1;
  undefined8 *puVar2;
  char cVar3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = *(undefined8 **)&this->m_providers;
  puVar2 = *(undefined8 **)&this->field_0x10;
  bVar5 = puVar4 != puVar2;
  if (bVar5) {
    cVar3 = (**(code **)(*(long *)*puVar4 + 0x38))();
    while (cVar3 == '\0') {
      puVar4 = puVar4 + 1;
      bVar5 = puVar4 != puVar2;
      if (puVar4 == puVar2) break;
      cVar3 = (**(code **)(*(long *)*puVar4 + 0x38))((long *)*puVar4,keyid,info);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool MultiSigningProvider::GetKeyOrigin(const CKeyID& keyid, KeyOriginInfo& info) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetKeyOrigin(keyid, info)) return true;
    }
    return false;
}